

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O3

void advanceStream(int nStream,long nCalls,int bUse64Bit)

{
  long lVar1;
  long *StartSeed;
  
  StartSeed = &Seed[nStream].value;
  if (bUse64Bit == 0) {
    NthElement(nCalls,StartSeed);
  }
  else {
    lVar1 = AdvanceRand64(*StartSeed,nCalls);
    *StartSeed = lVar1;
  }
  Seed[nStream].nCalls = Seed[nStream].nCalls + nCalls;
  return;
}

Assistant:

void 
advanceStream(int nStream, DSS_HUGE nCalls, int bUse64Bit)
{
   if (bUse64Bit)
      Seed[nStream].value = AdvanceRand64(Seed[nStream].value, nCalls);
   else
      NthElement(nCalls, &Seed[nStream].value);

#ifdef RNG_TEST
   Seed[nStream].nCalls += nCalls;
#endif

	return;
}